

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O0

bool __thiscall imrt::Station::isOpenBeamlet(Station *this,int beam,int aperture)

{
  bool bVar1;
  pair<int,_int> pVar2;
  reference pvVar3;
  reference pvVar4;
  int in_EDX;
  undefined4 in_ESI;
  long in_RDI;
  pair<int,_int> coord;
  int in_stack_00000050;
  int in_stack_00000054;
  Collimator *in_stack_00000058;
  
  pVar2 = Collimator::indexToPos(in_stack_00000058,in_stack_00000054,in_stack_00000050);
  bVar1 = Collimator::isActiveBeamAngle
                    ((Collimator *)CONCAT44(in_ESI,in_EDX),pVar2.second,pVar2.first,
                     (int)((ulong)in_RDI >> 0x20));
  if (bVar1) {
    pvVar3 = std::
             vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
             ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                           *)(in_RDI + 0x58),(long)in_EDX);
    pvVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                       (pvVar3,(long)pVar2.first);
    if (-1 < pvVar4->first) {
      pvVar3 = std::
               vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
               ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                             *)(in_RDI + 0x58),(long)in_EDX);
      pvVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                         (pvVar3,(long)pVar2.first);
      if (pvVar4->first <= pVar2.second) {
        pvVar3 = std::
                 vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                 ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                               *)(in_RDI + 0x58),(long)in_EDX);
        pvVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                           (pvVar3,(long)pVar2.first);
        if (pVar2.second <= pvVar4->second) {
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool Station::isOpenBeamlet(int beam, int aperture) {
  	auto coord = collimator.indexToPos(beam, angle);
        if (!collimator.isActiveBeamAngle(coord.first, coord.second,angle)) return(false);
    //cout << "Checking beamlet: " << beam << " angle:" << aperture << endl;
    //cout << "Position: " << coord.first << "," << coord.second << endl;
  	if (A[aperture][coord.first].first < 0 || A[aperture][coord.first].first > coord.second || A[aperture][coord.first].second< coord.second)
  	  return(false);
  	//cout << "Not closed" << endl;
  	return(true);
  }